

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UnicodeString *s)

{
  int32_t iVar1;
  int32_t cp;
  UnicodeString *s_local;
  UnicodeSet *this_local;
  
  iVar1 = UnicodeString::length(s);
  if (iVar1 == 0) {
    this_local._7_1_ = '\0';
  }
  else {
    iVar1 = getSingleCP(s);
    if (iVar1 < 0) {
      this_local._7_1_ = UVector::contains(this->strings,s);
    }
    else {
      this_local._7_1_ = contains(this,iVar1);
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool UnicodeSet::contains(const UnicodeString& s) const {
    if (s.length() == 0) return FALSE;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        return strings->contains((void*) &s);
    } else {
        return contains((UChar32) cp);
    }
}